

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::peer_connection::keep_alive(peer_connection *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  bitfield_flag local_29;
  rep local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  rep local_18;
  time_duration d;
  peer_connection *this_local;
  
  d.__r = (rep)this;
  local_20.__d.__r = (duration)libtorrent::aux::time_now();
  local_28 = (rep)std::chrono::operator-(&local_20,&this->m_last_sent);
  local_18 = local_28;
  iVar4 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_>)local_28);
  iVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x33])();
  if (((iVar2 / 2 <= iVar4) &&
      (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) == 0)) &&
     (uVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(), (uVar3 & 1) == 0)) {
    local_29 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>
                          )this->m_channel_state[0].m_val,
                          (bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>
                          )'\x04');
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_29);
    if (!bVar1) {
      peer_log(this,outgoing_message,"KEEPALIVE");
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x27])();
    }
  }
  return;
}

Assistant:

void peer_connection::keep_alive()
	{
		TORRENT_ASSERT(is_single_thread());
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

		time_duration const d = aux::time_now() - m_last_sent;
		if (total_seconds(d) < timeout() / 2) return;

		if (m_connecting) return;
		if (in_handshake()) return;

		// if the last send has not completed yet, do not send a keep
		// alive
		if (m_channel_state[upload_channel] & peer_info::bw_network) return;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message, "KEEPALIVE");
#endif

		write_keepalive();
	}